

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void anurbs::NurbsSurfaceGeometry<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
  *pcVar1;
  type local_849;
  arg local_848;
  arg local_838;
  arg local_828;
  arg local_818;
  code *local_808;
  undefined8 local_800;
  arg local_7f8;
  arg local_7e8;
  arg local_7d8;
  arg local_7c8;
  code *local_7b8;
  undefined8 local_7b0;
  arg local_7a8;
  arg local_798;
  arg local_788;
  arg local_778;
  code *local_768;
  undefined8 local_760;
  arg local_758;
  arg local_748;
  arg local_738;
  arg local_728;
  code *local_718;
  undefined8 local_710;
  arg local_708;
  arg local_6f8;
  code *local_6e8;
  undefined8 local_6e0;
  arg local_6d8;
  arg local_6c8;
  arg local_6b8;
  arg local_6a8;
  arg local_698;
  arg local_688;
  arg local_678;
  arg local_668;
  arg local_658;
  arg local_648;
  code *local_638;
  undefined8 local_630;
  arg local_628;
  arg local_618;
  arg local_608;
  arg local_5f8;
  arg local_5e8;
  arg local_5d8;
  code *local_5c8;
  undefined8 local_5c0;
  arg local_5b8;
  arg local_5a8;
  arg local_598;
  arg local_588;
  code *local_578;
  undefined8 local_570;
  arg local_568;
  arg local_558;
  code *local_548;
  undefined8 local_540;
  arg local_538;
  arg local_528;
  code *local_518;
  undefined8 local_510;
  offset_in_Model_to_subr local_500 [2];
  arg local_4f0;
  arg local_4e0;
  code *local_4d0;
  undefined8 local_4c8;
  offset_in_Model_to_subr local_4b8 [2];
  code *local_4a8;
  undefined8 local_4a0;
  code *local_498;
  undefined8 local_490;
  code *local_488;
  undefined8 local_480;
  offset_in_Model_to_subr local_470 [2];
  code *local_460;
  undefined8 local_458;
  code *local_450;
  undefined8 local_448;
  offset_in_Model_to_subr local_438 [2];
  code *local_428;
  undefined8 local_420;
  code *local_418;
  undefined8 local_410;
  offset_in_Model_to_subr local_400 [2];
  code *local_3f0;
  undefined8 local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  offset_in_Model_to_subr local_3c8 [2];
  code *local_3b8;
  undefined8 local_3b0;
  code *local_3a8;
  undefined8 local_3a0;
  code *local_398;
  undefined8 local_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  undefined8 local_370;
  code *local_368;
  undefined8 local_360;
  arg local_358;
  arg local_348;
  arg local_338;
  arg local_328;
  arg local_318;
  arg local_308;
  arg local_2f8;
  arg local_2e8;
  arg local_2d8;
  arg local_2c8;
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_std::vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>_>
  local_2b1;
  arg local_2b0;
  arg local_2a0;
  arg local_290;
  arg local_280;
  arg local_270;
  arg local_260;
  arg local_250;
  arg local_240;
  arg local_230;
  arg local_220;
  arg local_210;
  arg local_200;
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1e9;
  arg local_1e8;
  arg local_1d8;
  arg local_1c8;
  arg local_1b8;
  arg local_1a8;
  arg local_198;
  arg local_188;
  arg local_178;
  arg local_168;
  arg local_158;
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_2,_1,__1,_2>_>
  local_141;
  arg local_140;
  arg local_130;
  bool local_119;
  arg_v local_118;
  arg local_d8;
  arg local_c8;
  arg local_b8;
  arg local_a8;
  arg local_98;
  arg local_88;
  arg local_78;
  arg local_68;
  constructor<const_long,_const_long,_const_long,_const_long,_const_bool> local_55 [13];
  handle local_48;
  class_<anurbs::NurbsSurfaceGeometry<2L>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>_>
  local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<2L>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>_>
  ::class_<>(&local_40,local_48,name_00);
  pybind11::init<long_const,long_const,long_const,long_const,bool_const>();
  local_78 = pybind11::literals::operator____a("degree_u",8);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  local_98 = pybind11::literals::operator____a("degree_v",8);
  local_88.name = local_98.name;
  local_88._8_1_ = local_98._8_1_;
  local_b8 = pybind11::literals::operator____a("nb_poles_u",10);
  local_a8.name = local_b8.name;
  local_a8._8_1_ = local_b8._8_1_;
  local_d8 = pybind11::literals::operator____a("nb_poles_v",10);
  local_c8.name = local_d8.name;
  local_c8._8_1_ = local_d8._8_1_;
  local_119 = false;
  local_140 = pybind11::literals::operator____a("is_rational",0xb);
  local_130.name = local_140.name;
  local_130._8_1_ = local_140._8_1_;
  pybind11::arg::operator=(&local_118,&local_130,&local_119);
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<long_const,long_const,long_const,long_const,bool_const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
                        ((class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
                          *)&local_40,local_55,&local_68,&local_88,&local_a8,&local_c8,&local_118);
  pybind11::
  init<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,2,1,_1,2>const>
            ();
  local_168 = pybind11::literals::operator____a("degree_u",8);
  local_158.name = local_168.name;
  local_158._8_1_ = local_168._8_1_;
  local_188 = pybind11::literals::operator____a("degree_v",8);
  local_178.name = local_188.name;
  local_178._8_1_ = local_188._8_1_;
  local_1a8 = pybind11::literals::operator____a("knots_u",7);
  local_198.name = local_1a8.name;
  local_198._8_1_ = local_1a8._8_1_;
  local_1c8 = pybind11::literals::operator____a("knots_v",7);
  local_1b8.name = local_1c8.name;
  local_1b8._8_1_ = local_1c8._8_1_;
  local_1e8 = pybind11::literals::operator____a("poles",5);
  local_1d8.name = local_1e8.name;
  local_1d8._8_1_ = local_1e8._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,2,1,_1,2>const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_141,&local_158,&local_178,&local_198,&local_1b8,&local_1d8);
  pybind11::
  init<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,2,1,_1,2>const,Eigen::Matrix<double,_1,1,0,_1,1>const>
            ();
  local_210 = pybind11::literals::operator____a("degree_u",8);
  local_200.name = local_210.name;
  local_200._8_1_ = local_210._8_1_;
  local_230 = pybind11::literals::operator____a("degree_v",8);
  local_220.name = local_230.name;
  local_220._8_1_ = local_230._8_1_;
  local_250 = pybind11::literals::operator____a("knots_u",7);
  local_240.name = local_250.name;
  local_240._8_1_ = local_250._8_1_;
  local_270 = pybind11::literals::operator____a("knots_v",7);
  local_260.name = local_270.name;
  local_260._8_1_ = local_270._8_1_;
  local_290 = pybind11::literals::operator____a("poles",5);
  local_280.name = local_290.name;
  local_280._8_1_ = local_290._8_1_;
  local_2b0 = pybind11::literals::operator____a("weights",7);
  local_2a0.name = local_2b0.name;
  local_2a0._8_1_ = local_2b0._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,2,1,_1,2>const,Eigen::Matrix<double,_1,1,0,_1,1>const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_1e9,&local_200,&local_220,&local_240,&local_260,&local_280,
                         &local_2a0);
  pybind11::
  init<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>const>
            ();
  local_2d8 = pybind11::literals::operator____a("degree_u",8);
  local_2c8.name = local_2d8.name;
  local_2c8._8_1_ = local_2d8._8_1_;
  local_2f8 = pybind11::literals::operator____a("degree_v",8);
  local_2e8.name = local_2f8.name;
  local_2e8._8_1_ = local_2f8._8_1_;
  local_318 = pybind11::literals::operator____a("knots_u",7);
  local_308.name = local_318.name;
  local_308._8_1_ = local_318._8_1_;
  local_338 = pybind11::literals::operator____a("knots_v",7);
  local_328.name = local_338.name;
  local_328._8_1_ = local_338._8_1_;
  local_358 = pybind11::literals::operator____a("control_points",0xe);
  local_348.name = local_358.name;
  local_348._8_1_ = local_358._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<long_const,long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const,std::vector<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,2,1,1,2>,double>>>const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_2b1,&local_2c8,&local_2e8,&local_308,&local_328,&local_348);
  local_368 = NurbsSurfaceGeometry<2L>::is_rational;
  local_360 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<bool(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"is_rational",(offset_in_Model_to_subr *)&local_368);
  local_378 = NurbsSurfaceGeometry<2L>::nb_knots_u;
  local_370 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"nb_knots_u",(offset_in_Model_to_subr *)&local_378);
  local_388 = NurbsSurfaceGeometry<2L>::nb_knots_v;
  local_380 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"nb_knots_v",(offset_in_Model_to_subr *)&local_388);
  local_398 = NurbsSurfaceGeometry<2L>::nb_poles;
  local_390 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_398);
  local_3a8 = NurbsSurfaceGeometry<2L>::nb_poles_u;
  local_3a0 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"nb_poles_u",(offset_in_Model_to_subr *)&local_3a8);
  local_3b8 = NurbsSurfaceGeometry<2L>::nb_poles_v;
  local_3b0 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<2l>::*)()const>
                        (pcVar1,"nb_poles_v",(offset_in_Model_to_subr *)&local_3b8);
  local_3e0 = NurbsSurfaceGeometry<2L>::knots_u;
  local_3d8 = 0;
  local_3c8[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsSurfaceGeometry<2L>::knots_u,0);
  local_3f0 = NurbsSurfaceGeometry<2L>::set_knots_u;
  local_3e8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(),void(anurbs::NurbsSurfaceGeometry<2l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_u",local_3c8,(offset_in_Model_to_subr *)&local_3f0);
  local_418 = NurbsSurfaceGeometry<2L>::knots_v;
  local_410 = 0;
  local_400[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsSurfaceGeometry<2L>::knots_v,0);
  local_428 = NurbsSurfaceGeometry<2L>::set_knots_v;
  local_420 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(),void(anurbs::NurbsSurfaceGeometry<2l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_v",local_400,(offset_in_Model_to_subr *)&local_428);
  local_450 = NurbsSurfaceGeometry<2L>::poles;
  local_448 = 0;
  local_438[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsSurfaceGeometry<2L>::poles,0);
  local_460 = NurbsSurfaceGeometry<2L>::set_poles;
  local_458 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>,0,Eigen::OuterStride<_1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(),void(anurbs::NurbsSurfaceGeometry<2l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",local_438,(offset_in_Model_to_subr *)&local_460);
  local_488 = NurbsSurfaceGeometry<2L>::weights;
  local_480 = 0;
  local_470[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsSurfaceGeometry<2L>::weights,0);
  local_498 = NurbsSurfaceGeometry<2L>::set_weights;
  local_490 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(),void(anurbs::NurbsSurfaceGeometry<2l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",local_470,(offset_in_Model_to_subr *)&local_498);
  local_4a8 = NurbsSurfaceGeometry<2L>::clone;
  local_4a0 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>(anurbs::NurbsSurfaceGeometry<2l>::*)()>
                        (pcVar1,"clone",(offset_in_Model_to_subr *)&local_4a8);
  local_4d0 = NurbsSurfaceGeometry<2L>::knot_u;
  local_4c8 = 0;
  local_4b8[0] = pybind11::detail::overload_cast_impl<long>::operator()
                           ((overload_cast_impl<long> *)&pybind11::overload_cast<long>,
                            NurbsSurfaceGeometry<2L>::knot_u,0);
  local_4f0 = pybind11::literals::operator____a("index",5);
  local_4e0.name = local_4f0.name;
  local_4e0._8_1_ = local_4f0._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<2l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_u",local_4b8,&local_4e0);
  local_518 = NurbsSurfaceGeometry<2L>::knot_v;
  local_510 = 0;
  local_500[0] = pybind11::detail::overload_cast_impl<long>::operator()
                           ((overload_cast_impl<long> *)&pybind11::overload_cast<long>,
                            NurbsSurfaceGeometry<2L>::knot_v,0);
  local_538 = pybind11::literals::operator____a("index",5);
  local_528.name = local_538.name;
  local_528._8_1_ = local_538._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<2l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_v",local_500,&local_528);
  local_548 = NurbsSurfaceGeometry<2L>::pole;
  local_540 = 0;
  local_568 = pybind11::literals::operator____a("index",5);
  local_558.name = local_568.name;
  local_558._8_1_ = local_568._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::NurbsSurfaceGeometry<2l>::*)(long)const,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_548,&local_558);
  local_578 = NurbsSurfaceGeometry<2L>::pole;
  local_570 = 0;
  local_598 = pybind11::literals::operator____a("index_u",7);
  local_588.name = local_598.name;
  local_588._8_1_ = local_598._8_1_;
  local_5b8 = pybind11::literals::operator____a("index_v",7);
  local_5a8.name = local_5b8.name;
  local_5a8._8_1_ = local_5b8._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::NurbsSurfaceGeometry<2l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_578,&local_588,&local_5a8);
  local_5c8 = NurbsSurfaceGeometry<2L>::shape_functions_at;
  local_5c0 = 0;
  local_5e8 = pybind11::literals::operator____a("u",1);
  local_5d8.name = local_5e8.name;
  local_5d8._8_1_ = local_5e8._8_1_;
  local_608 = pybind11::literals::operator____a("v",1);
  local_5f8.name = local_608.name;
  local_5f8._8_1_ = local_608._8_1_;
  local_628 = pybind11::literals::operator____a("order",5);
  local_618.name = local_628.name;
  local_618._8_1_ = local_628._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_5c8,
                         &local_5d8,&local_5f8,&local_618);
  local_638 = NurbsSurfaceGeometry<2L>::shape_functions_at_span;
  local_630 = 0;
  local_658 = pybind11::literals::operator____a("u",1);
  local_648.name = local_658.name;
  local_648._8_1_ = local_658._8_1_;
  local_678 = pybind11::literals::operator____a("v",1);
  local_668.name = local_678.name;
  local_668._8_1_ = local_678._8_1_;
  local_698 = pybind11::literals::operator____a("span_u",6);
  local_688.name = local_698.name;
  local_688._8_1_ = local_698._8_1_;
  local_6b8 = pybind11::literals::operator____a("span_v",6);
  local_6a8.name = local_6b8.name;
  local_6a8._8_1_ = local_6b8._8_1_;
  local_6d8 = pybind11::literals::operator____a("order",5);
  local_6c8.name = local_6d8.name;
  local_6c8._8_1_ = local_6d8._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<2l>::*)(double,double,long,long,long)const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at_span",(offset_in_Model_to_subr *)&local_638,
                         &local_648,&local_668,&local_688,&local_6a8,&local_6c8);
  local_6e8 = NurbsSurfaceGeometry<2L>::weight;
  local_6e0 = 0;
  local_708 = pybind11::literals::operator____a("index",5);
  local_6f8.name = local_708.name;
  local_6f8._8_1_ = local_708._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::def<double(anurbs::NurbsSurfaceGeometry<2l>::*)(long)const,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_6e8,&local_6f8);
  local_718 = NurbsSurfaceGeometry<2L>::weight;
  local_710 = 0;
  local_738 = pybind11::literals::operator____a("index_u",7);
  local_728.name = local_738.name;
  local_728._8_1_ = local_738._8_1_;
  local_758 = pybind11::literals::operator____a("index_v",7);
  local_748.name = local_758.name;
  local_748._8_1_ = local_758._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<double(anurbs::NurbsSurfaceGeometry<2l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_718,&local_728,&local_748
                        );
  local_768 = NurbsSurfaceGeometry<2L>::greville_point;
  local_760 = 0;
  local_788 = pybind11::literals::operator____a("index_u",7);
  local_778.name = local_788.name;
  local_778._8_1_ = local_788._8_1_;
  local_7a8 = pybind11::literals::operator____a("index_v",7);
  local_798.name = local_7a8.name;
  local_798._8_1_ = local_7a8._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<std::pair<double,double>(anurbs::NurbsSurfaceGeometry<2l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_768,&local_778,
                         &local_798);
  local_7b8 = NurbsSurfaceGeometry<2L>::nonzero_pole_indices_at_span;
  local_7b0 = 0;
  local_7d8 = pybind11::literals::operator____a("span_u",6);
  local_7c8.name = local_7d8.name;
  local_7c8._8_1_ = local_7d8._8_1_;
  local_7f8 = pybind11::literals::operator____a("span_v",6);
  local_7e8.name = local_7f8.name;
  local_7e8._8_1_ = local_7f8._8_1_;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsSurfaceGeometry<2l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_7b8
                         ,&local_7c8,&local_7e8);
  local_808 = NurbsSurfaceGeometry<2L>::span_at;
  local_800 = 0;
  local_828 = pybind11::literals::operator____a("u",1);
  local_818.name = local_828.name;
  local_818._8_1_ = local_828._8_1_;
  local_848 = pybind11::literals::operator____a("v",1);
  local_838.name = local_848.name;
  local_838._8_1_ = local_848._8_1_;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<2l>,anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>>
  ::
  def<std::pair<long,long>(anurbs::NurbsSurfaceGeometry<2l>::*)(double,double)const,pybind11::arg,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_808,&local_818,&local_838);
  pybind11::arg_v::~arg_v(&local_118);
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<2L>,_anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>_>
  ::~class_(&local_40);
  pybind11::module::
  def<anurbs::NurbsSurfaceGeometry<2l>::register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>(pybind11::module&,pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>&)::_lambda(anurbs::Model&,std::shared_ptr<anurbs::NurbsSurfaceGeometry<2l>>)_1_>
            (m,"add",&local_849);
  Model::register_python_data_type<anurbs::NurbsSurfaceGeometry<2l>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsSurfaceGeometry<TDimension>;
        using Base = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const Index, const Index, const bool>(), "degree_u"_a, "degree_v"_a, "nb_poles_u"_a, "nb_poles_v"_a, "is_rational"_a = false)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles, const Eigen::VectorXd>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const std::vector<ControlPoint>>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots_u", &Type::nb_knots_u)
            .def_property_readonly("nb_knots_v", &Type::nb_knots_v)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            .def_property_readonly("nb_poles_u", &Type::nb_poles_u)
            .def_property_readonly("nb_poles_v", &Type::nb_poles_v)
            // properties
            .def_property("knots_u", py::overload_cast<>(&Type::knots_u), &Type::set_knots_u)
            .def_property("knots_v", py::overload_cast<>(&Type::knots_v), &Type::set_knots_v)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("clone", &Type::clone)
            .def("knot_u", py::overload_cast<Index>(&Type::knot_u), "index"_a)
            .def("knot_v", py::overload_cast<Index>(&Type::knot_v), "index"_a)
            .def("pole", (Vector(Type::*)(const Index) const) & Type::pole, "index"_a)
            .def("pole", (Vector(Type::*)(const Index, const Index) const) & Type::pole, "index_u"_a, "index_v"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "u"_a, "v"_a, "order"_a)
            .def("shape_functions_at_span", &Type::shape_functions_at_span, "u"_a, "v"_a, "span_u"_a, "span_v"_a, "order"_a)
            .def("weight", (double (Type::*)(const Index) const) & Type::weight, "index"_a)
            .def("weight", (double (Type::*)(const Index, const Index) const) & Type::weight, "index_u"_a, "index_v"_a)
            .def("greville_point", &Type::greville_point, "index_u"_a, "index_v"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span_u"_a, "span_v"_a)
            .def("span_at", &Type::span_at, "u"_a, "v"_a);

        m.def("add", [](Model& model, Holder data) { model.add<Type>(data); });

        Model::register_python_data_type<Type>(m, model);
    }